

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Rule * new_rule(Grammar *g,Production *p)

{
  Rule *__s;
  Elem *pEVar1;
  
  __s = (Rule *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->prod = p;
  pEVar1 = (Elem *)malloc(0x20);
  pEVar1->kind = ELEM_NTERM;
  pEVar1->index = 0;
  pEVar1->rule = (Rule *)0x0;
  (pEVar1->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar1->e + 8) = 0;
  __s->end = pEVar1;
  pEVar1->kind = ELEM_END;
  pEVar1->rule = __s;
  __s->action_index = g->action_index;
  return __s;
}

Assistant:

Rule *new_rule(Grammar *g, Production *p) {
  Rule *r = MALLOC(sizeof(Rule));
  memset(r, 0, sizeof(Rule));
  r->prod = p;
  r->end = new_elem();
  r->end->kind = ELEM_END;
  r->end->rule = r;
  r->action_index = g->action_index;
  return r;
}